

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

void __thiscall ON_FontList::Internal_EmptyLists(ON_FontList *this)

{
  ON_FontListImpl *pOVar1;
  
  if (-1 < (this->m_by_index).m_capacity) {
    (this->m_by_index).m_count = 0;
  }
  if (-1 < (this->m_unsorted).m_capacity) {
    (this->m_unsorted).m_count = 0;
  }
  pOVar1 = this->m_sorted;
  if (-1 < (pOVar1->m_by_font_characteristics_hash).m_capacity) {
    (pOVar1->m_by_font_characteristics_hash).m_count = 0;
  }
  if (-1 < (pOVar1->m_by_postscript_name).m_capacity) {
    (pOVar1->m_by_postscript_name).m_count = 0;
  }
  if (-1 < (pOVar1->m_by_windows_logfont_name).m_capacity) {
    (pOVar1->m_by_windows_logfont_name).m_count = 0;
  }
  if (-1 < (pOVar1->m_by_family_name).m_capacity) {
    (pOVar1->m_by_family_name).m_count = 0;
  }
  if (-1 < (pOVar1->m_by_english_postscript_name).m_capacity) {
    (pOVar1->m_by_english_postscript_name).m_count = 0;
  }
  if (-1 < (pOVar1->m_by_english_windows_logfont_name).m_capacity) {
    (pOVar1->m_by_english_windows_logfont_name).m_count = 0;
  }
  if (-1 < (pOVar1->m_by_english_family_name).m_capacity) {
    (pOVar1->m_by_english_family_name).m_count = 0;
  }
  if (-1 < (pOVar1->m_by_quartet_name).m_capacity) {
    (pOVar1->m_by_quartet_name).m_count = 0;
  }
  ON_ClassArray<ON_FontFaceQuartet>::Destroy(&this->m_quartet_list);
  return;
}

Assistant:

void ON_FontList::Internal_EmptyLists()
{
  m_by_index.SetCount(0);
  m_unsorted.SetCount(0);
  m_sorted.m_by_font_characteristics_hash.SetCount(0);
  m_sorted.m_by_postscript_name.SetCount(0);
  m_sorted.m_by_windows_logfont_name.SetCount(0);
  m_sorted.m_by_family_name.SetCount(0);
  m_sorted.m_by_english_postscript_name.SetCount(0);
  m_sorted.m_by_english_windows_logfont_name.SetCount(0);
  m_sorted.m_by_english_family_name.SetCount(0);
  m_sorted.m_by_quartet_name.SetCount(0);
  m_quartet_list.Destroy();
}